

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ashared_ptr.h
# Opt level: O0

void __thiscall ashared_ptr<MapWrapper>::reset(ashared_ptr<MapWrapper> *this)

{
  __pointer_type __p;
  ashared_ptr<MapWrapper> *in_RDI;
  PtrWrapper<MapWrapper> *ptr;
  lock_guard<std::mutex> l;
  mutex_type *in_stack_ffffffffffffffd8;
  memory_order __m;
  atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*> *in_stack_ffffffffffffffe8;
  PtrWrapper<MapWrapper> *in_stack_fffffffffffffff0;
  ashared_ptr<MapWrapper> *this_00;
  
  this_00 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffd8);
  __m = (memory_order)((ulong)in_RDI >> 0x20);
  __p = std::atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*>::load
                  (in_stack_ffffffffffffffe8,__m);
  std::atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*>::store
            ((atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*> *)in_stack_fffffffffffffff0,
             __p,__m);
  releaseObject(this_00,in_stack_fffffffffffffff0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10c97b);
  return;
}

Assistant:

void reset() {
        std::lock_guard<std::mutex> l(lock);
        PtrWrapper<T>* ptr = object.load(MO);
        // Unlink pointer first, destroy object next.
        object.store(nullptr, MO);
        releaseObject(ptr);
    }